

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Glucose::Solver::removeSatisfied(Solver *this,vec<unsigned_int> *cs)

{
  bool bVar1;
  long lVar2;
  Clause *c;
  int iVar3;
  long lVar4;
  
  iVar3 = 0;
  for (lVar4 = 0; lVar4 < cs->sz; lVar4 = lVar4 + 1) {
    c = (Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + cs->data[lVar4]);
    bVar1 = satisfied(this,c);
    if (bVar1) {
      removeClause(this,cs->data[lVar4],((c->header).field_0x1 & 4) != 0);
    }
    else {
      lVar2 = (long)iVar3;
      iVar3 = iVar3 + 1;
      cs->data[lVar2] = cs->data[lVar4];
    }
  }
  vec<unsigned_int>::shrink(cs,(int)lVar4 - iVar3);
  return;
}

Assistant:

void Solver::removeSatisfied(vec <CRef> &cs) {

    int i, j;
    for(i = j = 0; i < cs.size(); i++) {
        Clause &c = ca[cs[i]];


        if(satisfied(c)) if(c.getOneWatched())
            removeClause(cs[i], true);
        else
            removeClause(cs[i]);
        else
            cs[j++] = cs[i];
    }
    cs.shrink(i - j);
}